

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

int intEventCallback(int pi,uint event,void *f,void *user,int ex)

{
  int iVar1;
  evtCallback_t **ppeVar2;
  evtCallback_t *peVar3;
  
  iVar1 = -0x7d8;
  if (f != (void *)0x0 && event < 0x20) {
    ppeVar2 = &geCallBackFirst;
    while (peVar3 = *ppeVar2, peVar3 != (evtCallback_t *)0x0) {
      if (((peVar3->pi == pi) && (peVar3->event == event)) && (peVar3->f == (CBF_t)f)) {
        return -0x7d6;
      }
      ppeVar2 = &peVar3->next;
    }
    peVar3 = (evtCallback_t *)malloc(0x38);
    if (peVar3 == (evtCallback_t *)0x0) {
      iVar1 = -0x7d7;
    }
    else {
      if (geCallBackFirst == (evtCallback_t *)0x0) {
        geCallBackFirst = peVar3;
      }
      peVar3->id = intEventCallback::id;
      peVar3->pi = pi;
      peVar3->event = event;
      peVar3->f = (CBF_t)f;
      peVar3->user = user;
      peVar3->ex = ex;
      peVar3->next = (evtCallback_t *)0x0;
      intEventCallback::id = intEventCallback::id + 1;
      peVar3->prev = geCallBackLast;
      if (geCallBackLast != (evtCallback_t *)0x0) {
        geCallBackLast->next = peVar3;
      }
      geCallBackLast = peVar3;
      findEventBits(pi);
      iVar1 = peVar3->id;
    }
  }
  return iVar1;
}

Assistant:

static int intEventCallback(
   int pi, unsigned event, void *f, void *user, int ex)
{
   static int id = 0;
   evtCallback_t *ep;

   if ((event >=0) && (event < 32) && f)
   {
      /* prevent duplicates */

      ep = geCallBackFirst;

      while (ep)
      {
         if ((ep->pi    == pi)    &&
             (ep->event == event) &&
             (ep->f     == f))
         {
            return pigif_duplicate_callback;
         }
         ep = ep->next;
      }

      ep = malloc(sizeof(evtCallback_t));

      if (ep)
      {
         if (!geCallBackFirst) geCallBackFirst = ep;

         ep->id = id++;
         ep->pi = pi;
         ep->event = event;
         ep->f = f;
         ep->user = user;
         ep->ex = ex;
         ep->next = 0;
         ep->prev = geCallBackLast;

         if (ep->prev) (ep->prev)->next = ep;
         geCallBackLast = ep;

         findEventBits(pi);

         return ep->id;
      }

      return pigif_bad_malloc;
   }

   return pigif_bad_callback;
}